

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_CustomMeleeAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  int iVar2;
  AActor *self;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  VMValue *pVVar7;
  AActor *pAVar8;
  char *pcVar9;
  int iVar10;
  bool bVar11;
  FSoundID local_44;
  FName local_40;
  FSoundID local_3c;
  DAngle local_38;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      self = *(AActor **)&param->field_0;
      if (self != (AActor *)0x0) {
        if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar6 = (self->super_DThinker).super_DObject.Class;
        bVar11 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar11) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar11 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar11) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003cb348;
        }
      }
      if (numparam == 1) {
        pVVar7 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cb367:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6aa,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar7 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003cb367;
        }
      }
      iVar4 = pVVar7[1].field_0.i;
      if (numparam < 3) {
        pVVar7 = defaultparam->Array;
        if (pVVar7[2].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003cb386;
        }
      }
      else {
        pVVar7 = param;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003cb386:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ab,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar5 = pVVar7[2].field_0.i;
      if (numparam < 4) {
        pVVar7 = defaultparam->Array;
        if (pVVar7[3].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003cb3a5;
        }
      }
      else {
        pVVar7 = param;
        if (param[3].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003cb3a5:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ac,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar1 = pVVar7[3].field_0.i;
      if (numparam < 5) {
        pVVar7 = defaultparam->Array;
        if (pVVar7[4].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003cb3c4;
        }
      }
      else {
        pVVar7 = param;
        if (param[4].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003cb3c4:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ad,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      if (numparam < 6) {
        param = defaultparam->Array;
        if (param[5].field_0.field_3.Type == '\0') goto LAB_003cb205;
        pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[5].field_0.field_3.Type == '\0') {
LAB_003cb205:
          iVar10 = 0x89;
          if (pVVar7[4].field_0.i != 0) {
            iVar10 = pVVar7[4].field_0.i;
          }
          pAVar8 = (self->target).field_0.p;
          if (pAVar8 != (AActor *)0x0) {
            if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              iVar2 = param[5].field_0.i;
              A_FaceTarget(self);
              bVar11 = AActor::CheckMeleeRange(self);
              if (bVar11) {
                if (iVar5 != 0) {
                  local_3c.ID = iVar5;
                  S_Sound(self,1,&local_3c,1.0,1.0);
                }
                pAVar8 = (self->target).field_0.p;
                if ((pAVar8 != (AActor *)0x0) &&
                   (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                  (self->target).field_0.p = (AActor *)0x0;
                  pAVar8 = (AActor *)0x0;
                }
                local_38.Degrees = 0.0;
                local_40.Index = iVar10;
                iVar5 = P_DamageMobj(pAVar8,self,self,iVar4,&local_40,0,&local_38);
                if (iVar2 != 0) {
                  if (0 < iVar5) {
                    iVar4 = iVar5;
                  }
                  pAVar8 = (self->target).field_0.p;
                  if ((pAVar8 != (AActor *)0x0) &&
                     (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (self->target).field_0.p = (AActor *)0x0;
                    pAVar8 = (AActor *)0x0;
                  }
                  P_TraceBleed(iVar4,pAVar8,self);
                }
              }
              else if (iVar1 != 0) {
                local_44.ID = iVar1;
                S_Sound(self,1,&local_44,1.0,1.0);
              }
            }
            else {
              (self->target).field_0.p = (AActor *)0x0;
            }
          }
          return 0;
        }
        pcVar9 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6ae,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003cb348:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x6a9,
                "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomMeleeAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(damage);
	PARAM_SOUND_DEF	(meleesound);
	PARAM_SOUND_DEF	(misssound);
	PARAM_NAME_DEF	(damagetype);
	PARAM_BOOL_DEF	(bleed);

	if (damagetype == NAME_None)
		damagetype = NAME_Melee;	// Melee is the default type

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		if (meleesound)
			S_Sound (self, CHAN_WEAPON, meleesound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, damagetype);
		if (bleed)
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else
	{
		if (misssound)
			S_Sound (self, CHAN_WEAPON, misssound, 1, ATTN_NORM);
	}
	return 0;
}